

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::TransformNode> *node,ssize_t id)

{
  undefined8 *puVar1;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar2;
  TransformNode *pTVar3;
  size_t i;
  ulong uVar4;
  string *this_00;
  long lVar5;
  Ref<embree::SceneGraph::Node> local_108;
  Ref<embree::SceneGraph::Node> local_100;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  if ((node->ptr->spaces).spaces.size_active == 1) {
    std::__cxx11::string::string(local_50,"Transform",(allocator *)&local_f8.field_1);
    open(this,(char *)local_50,(int)id);
    std::__cxx11::string::~string(local_50);
    pAVar2 = (node->ptr->spaces).spaces.items;
    local_f8._0_8_ = *(undefined8 *)&(pAVar2->l).vx.field_0;
    local_f8._8_8_ = *(undefined8 *)((long)&(pAVar2->l).vx.field_0 + 8);
    local_e8 = *(undefined8 *)&(pAVar2->l).vy.field_0;
    uStack_e0 = *(undefined8 *)((long)&(pAVar2->l).vy.field_0 + 8);
    local_d8 = *(undefined8 *)&(pAVar2->l).vz.field_0;
    uStack_d0 = *(undefined8 *)((long)&(pAVar2->l).vz.field_0 + 8);
    local_c8 = *(undefined8 *)&(pAVar2->p).field_0;
    uStack_c0 = *(undefined8 *)((long)&(pAVar2->p).field_0 + 8);
    store(this,"AffineSpace",(AffineSpace3fa *)&local_f8.field_1);
    local_100.ptr = (node->ptr->child).ptr;
    if (local_100.ptr != (Node *)0x0) {
      (*((local_100.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    store(this,&local_100);
    if (local_100.ptr != (Node *)0x0) {
      (*((local_100.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    std::__cxx11::string::string(local_70,"Transform",(allocator *)&local_f8.field_1);
    close(this,(int)local_70);
    this_00 = local_70;
  }
  else {
    std::__cxx11::string::string(local_90,"TransformAnimation",(allocator *)&local_f8.field_1);
    open(this,(char *)local_90,(int)id);
    std::__cxx11::string::~string(local_90);
    lVar5 = 0x30;
    for (uVar4 = 0; pTVar3 = node->ptr, uVar4 < (pTVar3->spaces).spaces.size_active;
        uVar4 = uVar4 + 1) {
      pAVar2 = (pTVar3->spaces).spaces.items;
      puVar1 = (undefined8 *)((long)pAVar2 + lVar5 + -0x30);
      local_f8._0_8_ = *puVar1;
      local_f8._8_8_ = puVar1[1];
      puVar1 = (undefined8 *)((long)pAVar2 + lVar5 + -0x20);
      local_e8 = *puVar1;
      uStack_e0 = puVar1[1];
      puVar1 = (undefined8 *)((long)pAVar2 + lVar5 + -0x10);
      local_d8 = *puVar1;
      uStack_d0 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pAVar2->l).vx.field_0 + lVar5);
      local_c8 = *puVar1;
      uStack_c0 = puVar1[1];
      store(this,"AffineSpace",(AffineSpace3fa *)&local_f8.field_1);
      lVar5 = lVar5 + 0x40;
    }
    local_108.ptr = (pTVar3->child).ptr;
    if (local_108.ptr != (Node *)0x0) {
      (*((local_108.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    store(this,&local_108);
    if (local_108.ptr != (Node *)0x0) {
      (*((local_108.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    std::__cxx11::string::string(local_b0,"TransformAnimation",(allocator *)&local_f8.field_1);
    close(this,(int)local_b0);
    this_00 = local_b0;
  }
  std::__cxx11::string::~string(this_00);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::TransformNode> node, ssize_t id)
  {
    if (node->spaces.size() == 1)
    {
      open("Transform",id);
      store("AffineSpace",node->spaces[0]);
      store(node->child);
      close("Transform");
    }
    else 
    {
      open("TransformAnimation",id);
      for (size_t i=0; i<node->spaces.size(); i++)
        store("AffineSpace",node->spaces[i]);
      store(node->child);
      close("TransformAnimation");
    }
  }